

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_parse_json_string_literal
                    (bstr_context_t *ctx,uint8_t *pBegin,uint8_t *pEnd,adt_str_t *str)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  byte bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  
  auVar13._0_4_ = -(uint)(ctx == (bstr_context_t *)0x0);
  auVar13._4_4_ = -(uint)(pBegin == (uint8_t *)0x0);
  auVar13._8_4_ = -(uint)(pEnd == (uint8_t *)0x0);
  auVar13._12_4_ = -(uint)(str == (adt_str_t *)0x0);
  iVar8 = movmskps((int)str,auVar13);
  if (iVar8 == 0 && pBegin <= pEnd) {
    if ((pBegin < pEnd) && (pbVar10 = pBegin + 1, pbVar10 < pEnd && *pBegin == '\"')) {
      uVar4 = 0;
      bVar11 = 0;
      cVar7 = '\0';
      bVar12 = false;
      do {
        bVar1 = *pbVar10;
        pbVar10 = pbVar10 + 1;
        if (bVar12) {
          bVar12 = cVar7 == 'u';
          if (bVar12) {
            if (bVar11 < 4) {
              uVar4 = uVar4 << 4 | ASCIIHexToInt[bVar1];
              bVar11 = bVar11 + 1;
            }
            if (bVar11 != 4) {
LAB_00101959:
              cVar7 = 'u';
              bVar12 = true;
              goto LAB_0010199a;
            }
            cVar7 = '\0';
            bVar11 = 0;
            uVar2 = 0;
            uVar9 = uVar4;
          }
          else {
            if (bVar1 == 0x75) goto LAB_00101959;
            lVar6 = 0;
            while (bVar1 != (&DAT_00102000)[lVar6]) {
              lVar6 = lVar6 + 1;
              if (lVar6 == 8) goto LAB_001019a5;
            }
            uVar9 = (uint)(byte)(&DAT_00102008)[lVar6];
            uVar2 = uVar4;
          }
          adt_str_push(str,uVar9);
          uVar4 = uVar2;
        }
        else {
          bVar12 = true;
          if (bVar1 != 0x5c) {
            if (bVar1 == 0x22) {
              return pbVar10;
            }
            if (bVar1 < 0x20) {
LAB_001019a5:
              ctx->lastError = 4;
              goto LAB_00101867;
            }
            cVar3 = adt_str_push(str);
            if (cVar3 != '\0') {
              ctx->lastError = 5;
              goto LAB_00101867;
            }
            bVar12 = false;
          }
        }
LAB_0010199a:
      } while (pbVar10 != pEnd);
    }
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
LAB_00101867:
    pBegin = (uint8_t *)0x0;
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_parse_json_string_literal(bstr_context_t *ctx, const uint8_t *pBegin, const uint8_t *pEnd, adt_str_t *str)
{
#define NUM_ESCAPE_CHARS 8
   const uint8_t quotationMark = '"';
   const uint8_t backslash = '\\';
   const uint8_t frontslash = '/';
   const uint8_t backspace = '\b';
   const uint8_t formfeed = '\f';
   const uint8_t linefeed = '\n';
   const uint8_t carriageReturn = '\r';
   const uint8_t horizontalTab = '\t';
   const uint8_t validEscapeChars[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         'b',
         'f',
         'n',
         'r',
         't'
   };
   const uint8_t escapeCharMap[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         backspace,
         formfeed,
         linefeed,
         carriageReturn,
         horizontalTab,
   };

   if ( (ctx == 0) || (pBegin == 0) || (pEnd == 0) || (str == 0) || (pEnd < pBegin) )
   {
      errno = EINVAL;
      return (const uint8_t*) 0;
   }
   if (pBegin < pEnd)
   {
      uint8_t firstChar = *pBegin;
      if (firstChar == quotationMark)
      {
         const uint8_t *pNext = pBegin+1;
         bool isEscapeSequence = false;
         uint8_t escapeType = 0u;
         uint8_t numDigits = 0u;
         uint32_t value = 0u;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext++;
            if (isEscapeSequence)
            {
               if (escapeType == 'u')
               {
                  if (numDigits<4)
                  {
                     value<<=4;
                     value|=ASCIIHexToInt[c];
                     numDigits++;
                  }
                  if (numDigits==4)
                  {
                     //TODO: adt_str_push does not yet support unicode, will need to fix that.
                     //TODO: JSON can contain two \u sequences in a row to allow large code points. Will implement that later.
                     adt_str_push(str, (int) value);
                     escapeType = 0u;
                     numDigits = 0u;
                     value = 0u;
                  }
               }
               else
               {
                  if (c == 'u')
                  {
                     escapeType = c;
                  }
                  else
                  {
                     int32_t i;
                     for (i=0; i<NUM_ESCAPE_CHARS; i++)
                     {
                        if (c==validEscapeChars[i])
                        {
                           break;
                        }
                     }
                     if (i < NUM_ESCAPE_CHARS)
                     {
                        adt_str_push(str, escapeCharMap[i]);
                        isEscapeSequence = false;
                     }
                     else
                     {
                        bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                        return (const uint8_t*) 0;
                     }
                  }
               }
            }
            else
            {
               if (c == quotationMark)
               {
                  return pNext;
               }
               else if (c == backslash)
               {
                  isEscapeSequence = true;
               }
               else if (bstr_pred_is_control_char(c))
               {
                  bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                  return (const uint8_t*) 0;
               }
               else
               {
                  adt_error_t result = adt_str_push(str, c);
                  if (result != ADT_NO_ERROR)
                  {
                     bstr_set_error(ctx, BSTR_MEM_ERROR);
                     return (const uint8_t*) 0;
                  }
               }
            }
         }
      }
   }
   return pBegin;
#undef NUM_ESCAPE_CHARS
}